

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O0

int ogg_sync_pageout(ogg_sync_state *oy,ogg_page *og)

{
  int iVar1;
  long lVar2;
  long ret;
  ogg_page *og_local;
  ogg_sync_state *oy_local;
  
  iVar1 = ogg_sync_check(oy);
  if (iVar1 == 0) {
    do {
      lVar2 = ogg_sync_pageseek(oy,og);
      if (0 < lVar2) {
        return 1;
      }
      if (lVar2 == 0) {
        return 0;
      }
    } while (oy->unsynced != 0);
    oy->unsynced = 1;
    oy_local._4_4_ = -1;
  }
  else {
    oy_local._4_4_ = 0;
  }
  return oy_local._4_4_;
}

Assistant:

int ogg_sync_pageout(ogg_sync_state *oy, ogg_page *og){

  if(ogg_sync_check(oy))return 0;

  /* all we need to do is verify a page at the head of the stream
     buffer.  If it doesn't verify, we look for the next potential
     frame */

  for(;;){
    long ret=ogg_sync_pageseek(oy,og);
    if(ret>0){
      /* have a page */
      return(1);
    }
    if(ret==0){
      /* need more data */
      return(0);
    }

    /* head did not start a synced page... skipped some bytes */
    if(!oy->unsynced){
      oy->unsynced=1;
      return(-1);
    }

    /* loop. keep looking */

  }
}